

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O2

void __thiscall QPDFLogger::setError(QPDFLogger *this,shared_ptr<Pipeline> *p)

{
  if ((p->super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>)._M_ptr == (element_type *)0x0) {
    std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&p->super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>,
               &(((this->m).super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->p_stderr).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>);
  }
  std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((this->m).super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->p_error).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>,
             &p->super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void
QPDFLogger::setError(std::shared_ptr<Pipeline> p)
{
    if (p == nullptr) {
        p = m->p_stderr;
    }
    m->p_error = p;
}